

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O1

bool ft::operator<(deque<int,_ft::allocator<int>_> *lhs,deque<int,_ft::allocator<int>_> *rhs)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  map_pointer ppvVar4;
  map_pointer ppvVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  bool bVar9;
  
  piVar6 = (lhs->m_start).m_cur;
  piVar1 = (lhs->m_finish).m_cur;
  piVar3 = (rhs->m_start).m_cur;
  piVar2 = (rhs->m_finish).m_cur;
  if (piVar6 == piVar1) {
LAB_0010e6b8:
    bVar9 = piVar3 != piVar2;
  }
  else {
    if (piVar3 != piVar2) {
      piVar7 = (lhs->m_start).m_last;
      ppvVar5 = (lhs->m_start).m_node;
      piVar8 = (rhs->m_start).m_last;
      ppvVar4 = (rhs->m_start).m_node;
      do {
        if (*piVar3 < *piVar6) break;
        if (*piVar6 < *piVar3) {
          return true;
        }
        piVar6 = piVar6 + 1;
        if (piVar6 == piVar7) {
          piVar6 = ppvVar5[1];
          ppvVar5 = ppvVar5 + 1;
          piVar7 = piVar6 + 0x40;
        }
        piVar3 = piVar3 + 1;
        if (piVar3 == piVar8) {
          piVar3 = ppvVar4[1];
          ppvVar4 = ppvVar4 + 1;
          piVar8 = piVar3 + 0x40;
        }
        if (piVar6 == piVar1) goto LAB_0010e6b8;
      } while (piVar3 != piVar2);
    }
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool operator<(deque<T, Alloc> const & lhs, deque<T, Alloc> const & rhs) {
	return ft::lexicographical_compare(lhs.begin(), lhs.end(), rhs.begin(), rhs.end());
}